

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O2

void uavs3d_ipred_ang_xy_13_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  long lVar5;
  undefined1 auVar6 [16];
  int iVar7;
  uint uVar8;
  ulong uVar9;
  pel *ppVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  byte *pbVar18;
  long lVar19;
  int d;
  long lVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar33 [32];
  undefined1 auVar36 [32];
  
  auVar6 = _DAT_00179e10;
  iVar16 = 7;
  if (height < 7) {
    iVar16 = height;
  }
  lVar20 = 0;
  if (iVar16 < 1) {
    iVar16 = 0;
  }
  lVar19 = (long)width;
  ppVar10 = src + 8;
  uVar11 = 1;
  auVar24._16_16_ = _DAT_00179e10;
  auVar24._0_16_ = _DAT_00179e10;
  auVar25._8_2_ = 0x40;
  auVar25._0_8_ = 0x40004000400040;
  auVar25._10_2_ = 0x40;
  auVar25._12_2_ = 0x40;
  auVar25._14_2_ = 0x40;
  while ((int)lVar20 != iVar16) {
    lVar17 = -(uVar11 >> 3) + -1;
    lVar20 = lVar20 + 1;
    iVar7 = ((int)lVar20 * 4 & 0x1cU) * -0x100feff + 0x20402000;
    auVar26._4_4_ = iVar7;
    auVar26._0_4_ = iVar7;
    auVar26._8_4_ = iVar7;
    auVar26._12_4_ = iVar7;
    auVar27._16_4_ = iVar7;
    auVar27._0_16_ = auVar26;
    auVar27._20_4_ = iVar7;
    auVar27._24_4_ = iVar7;
    auVar27._28_4_ = iVar7;
    for (lVar12 = 0; lVar12 + 4 < lVar19; lVar12 = lVar12 + 8) {
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(src + lVar12 + -(uVar11 >> 3) + 3);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(src + lVar12 + lVar17);
      auVar30._0_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar31;
      auVar30._16_16_ = ZEXT116(1) * auVar28;
      auVar30 = vpshufb_avx2(auVar30,auVar24);
      auVar30 = vpmaddubsw_avx2(auVar30,auVar27);
      auVar28 = vphaddw_avx(auVar30._0_16_,auVar30._16_16_);
      auVar28 = vpaddw_avx(auVar28,auVar25);
      auVar28 = vpsrlw_avx(auVar28,7);
      auVar28 = vpackuswb_avx(auVar28,auVar28);
      *(long *)(dst + lVar12) = auVar28._0_8_;
    }
    if ((int)lVar12 < width) {
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(src + lVar12 + lVar17);
      auVar28 = vpshufb_avx(auVar29,auVar6);
      auVar26 = vpmaddubsw_avx(auVar28,auVar26);
      auVar26 = vphaddw_avx(auVar26,auVar26);
      auVar26 = vpaddw_avx(auVar26,auVar25);
      auVar26 = vpsrlw_avx(auVar26,7);
      auVar26 = vpackuswb_avx(auVar26,auVar26);
      *(int *)(dst + lVar12) = auVar26._0_4_;
    }
    dst = dst + i_dst;
    ppVar10 = ppVar10 + -1;
    uVar11 = uVar11 + 1;
  }
  if (width == 4) {
    while (lVar20 < height) {
      lVar20 = lVar20 + 1;
      iVar16 = (int)((double)(int)lVar20 * 0.125 + 0.9999);
      uVar8 = iVar16 - 1;
      uVar14 = (int)lVar20 * 4 & 0x1c;
      if (3 < (int)uVar8) {
        uVar8 = 4;
      }
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      uVar23 = (ulong)uVar8;
      for (uVar9 = 0; uVar23 != uVar9; uVar9 = uVar9 + 1) {
        dst[uVar9] = (pel)((uint)ppVar10[uVar9 * 8 + -2] + (uint)ppVar10[uVar9 * 8 + -1] * 2 +
                           (uint)ppVar10[uVar9 * 8] + 2 >> 2);
      }
      lVar17 = (long)iVar16 - (uVar11 >> 3);
      for (lVar19 = 0; ((4 - uVar8) - uVar23) + uVar9 != lVar19; lVar19 = lVar19 + 1) {
        dst[lVar19 + uVar23] =
             (pel)((uint)src[lVar19 + lVar17 + -1] * (uVar14 + 0x20) +
                   (uint)src[lVar19 + lVar17] * (0x40 - uVar14) +
                   (uint)src[lVar19 + lVar17 + 1] * (0x20 - uVar14) +
                   src[lVar19 + lVar17 + -2] * uVar14 + 0x40 >> 7);
      }
      dst = dst + i_dst;
      ppVar10 = ppVar10 + -1;
      uVar11 = uVar11 + 1;
    }
  }
  else {
    while (lVar20 < height) {
      lVar20 = lVar20 + 1;
      iVar16 = (int)((double)(int)lVar20 * 0.125 + 0.9999);
      uVar14 = iVar16 - 1;
      uVar22 = (int)lVar20 * 4 & 0x1c;
      uVar8 = (0x20 - uVar22) * 0x1000000 | (0x40 - uVar22) * 0x10000 | (uVar22 + 0x20) * 0x100 |
              uVar22;
      auVar32._4_4_ = uVar8;
      auVar32._0_4_ = uVar8;
      auVar32._8_4_ = uVar8;
      auVar32._12_4_ = uVar8;
      auVar33._16_4_ = uVar8;
      auVar33._0_16_ = auVar32;
      auVar33._20_4_ = uVar8;
      auVar33._24_4_ = uVar8;
      auVar33._28_4_ = uVar8;
      uVar8 = width;
      if ((int)uVar14 < width) {
        uVar8 = uVar14;
      }
      uVar9 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar9 = 0;
      }
      for (uVar23 = 0; uVar9 != uVar23; uVar23 = uVar23 + 1) {
        dst[uVar23] = (pel)((uint)ppVar10[uVar23 * 8] +
                            (uint)ppVar10[uVar23 * 8 + -2] + (uint)ppVar10[uVar23 * 8 + -1] * 2 + 2
                           >> 2);
      }
      lVar17 = (long)(int)uVar14;
      if (lVar19 <= (int)uVar14) {
        lVar17 = lVar19;
      }
      lVar15 = lVar17 << 0x20;
      lVar13 = (long)iVar16 - (uVar11 >> 3);
      for (lVar12 = 0; lVar21 = lVar17 + lVar12, lVar21 < lVar19 + -7; lVar12 = lVar12 + 8) {
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(src + lVar12 + lVar13 + 2);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)(src + lVar12 + lVar13 + -2);
        auVar36._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar37;
        auVar36._16_16_ = ZEXT116(1) * auVar34;
        auVar27 = vpshufb_avx2(auVar36,auVar24);
        auVar27 = vpmaddubsw_avx2(auVar27,auVar33);
        auVar26 = vphaddw_avx(auVar27._0_16_,auVar27._16_16_);
        auVar26 = vpaddw_avx(auVar26,auVar25);
        auVar26 = vpsrlw_avx(auVar26,7);
        auVar26 = vpackuswb_avx(auVar26,auVar26);
        *(long *)(dst + lVar12 + lVar17) = auVar26._0_8_;
        lVar15 = lVar15 + 0x800000000;
      }
      if ((int)lVar21 + 3 < width) {
        lVar5 = lVar12 + lVar13 + 3;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)(src + lVar12 + lVar13 + -2);
        auVar26 = vpshufb_avx(auVar35,auVar6);
        auVar26 = vpmaddubsw_avx(auVar26,auVar32);
        auVar26 = vphaddw_avx(auVar26,auVar26);
        auVar26 = vpaddw_avx(auVar26,auVar25);
        auVar26 = vpsrlw_avx(auVar26,7);
        auVar26 = vpackuswb_avx(auVar26,auVar26);
        *(int *)(dst + (lVar15 >> 0x20)) = auVar26._0_4_;
        lVar21 = lVar17 + lVar12 + 4;
      }
      else {
        lVar5 = lVar12 + lVar13 + -1;
      }
      pbVar18 = src + lVar5;
      for (lVar17 = (long)(int)lVar21; lVar17 < lVar19; lVar17 = lVar17 + 1) {
        pbVar1 = pbVar18 + 2;
        pbVar2 = pbVar18 + 1;
        bVar4 = *pbVar18;
        pbVar3 = pbVar18 + -1;
        pbVar18 = pbVar18 + 1;
        dst[lVar17] = (pel)((uint)bVar4 * (uVar22 + 0x20) +
                            (uint)*pbVar2 * (0x40 - uVar22) + (uint)*pbVar1 * (0x20 - uVar22) +
                            *pbVar3 * uVar22 + 0x40 >> 7);
      }
      dst = dst + i_dst;
      ppVar10 = ppVar10 + -1;
      uVar11 = uVar11 + 1;
    }
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_xy_13_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    int i, j;
    pel *psrc = src;
    int step1_height = COM_MIN(height, 7);

    __m256i shuffle_x = _mm256_setr_epi8(0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6, 0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6);
    __m128i c_64 = _mm_set1_epi16(64);

    for (j = 0; j < step1_height; j++) {
        int d = j + 1;
        pel *px = src - (d >> 3);
        int offsetx = (d << 2) & 0x1f;
        int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
        __m256i coeff_x = _mm256_set1_epi32(offsetx + (c << 8) + (b << 16) + (a << 24));

        for (i = 0; i + 4 < width; i += 8, px += 8) {
            IPRED_ANG_XY_X8(px, shuffle_x, coeff_x, c_64, 7, dst + i)
        }
        if (i < width) {
            IPRED_ANG_XY_X4(px, _mm256_castsi256_si128(shuffle_x), _mm256_castsi256_si128(coeff_x), c_64, 7, dst + i)
        }
        dst += i_dst;
    }

    if (width == 4) {
        for (; j < height; j++) {
            int d = j + 1;
            int step1_width = (int)(((j + 1) / 8.0 + 0.9999)) - 1;
            int offsetx = (d << 2) & 0x1f;
            int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
            pel *px = src + step1_width - (d >> 3);
            pel *py = psrc - j + 8;

            step1_width = COM_MIN(step1_width, width);

            for (i = 0; i < step1_width; i++, py += 8) {
                dst[i] = (py[-2] + (py[-1] << 1) + py[0] + 2) >> 2;
            }
            for (; i < width; i++, px++) {
                dst[i] = (px[2] * a + px[1] * b + px[0] * c + px[-1] * offsetx + 64) >> 7;
            }
            dst += i_dst;
        }
    }
    else {
        for (; j < height; j++) {
            int d = j + 1;
            int step1_width = (int)(((j + 1) / 8.0 + 0.9999)) - 1;
            int offsetx = (d << 2) & 0x1f;
            int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
            pel *px = src + step1_width - (d >> 3);
            pel *py = psrc - j + 8;
            __m256i coeff_x = _mm256_set1_epi32(offsetx + (c << 8) + (b << 16) + (a << 24));

            step1_width = COM_MIN(step1_width, width);

            for (i = 0; i < step1_width; i++, py += 8) {
                dst[i] = (py[-2] + (py[-1] << 1) + py[0] + 2) >> 2;
            }

            for (i = step1_width; i + 7 < width; i += 8, px += 8) {
                IPRED_ANG_XY_X8(px, shuffle_x, coeff_x, c_64, 7, dst + i)
            }
            if (i + 3 < width) {
                IPRED_ANG_XY_X4(px, _mm256_castsi256_si128(shuffle_x), _mm256_castsi256_si128(coeff_x), c_64, 7, dst + i)
                    i += 4;
                px += 4;
            }
            for (; i < width; i++, px++) {
                dst[i] = (px[2] * a + px[1] * b + px[0] * c + px[-1] * offsetx + 64) >> 7;
            }
            dst += i_dst;
        }
    }
}